

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# half_perf_test.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  void *pvVar4;
  void *pvVar5;
  long lVar6;
  long in_RSI;
  int in_EDI;
  float fVar7;
  double dVar8;
  int unaff_retaddr;
  float *in_stack_00000008;
  int i_1;
  int i;
  Rand48 r;
  float *floats;
  uint16_t *halfs;
  int numentries;
  int ret;
  unsigned_long in_stack_ffffffffffffffb8;
  Rand48 *in_stack_ffffffffffffffc0;
  int iVar9;
  int iVar10;
  Rand48 *in_stack_ffffffffffffffd0;
  int local_18;
  uint local_14;
  
  local_14 = 0;
  local_18 = 0x5eec00;
  if (1 < in_EDI) {
    local_18 = atoi(*(char **)(in_RSI + 8));
    if (local_18 < 1) {
      fprintf(_stderr,"Bad entry count \'%s\'\n",*(undefined8 *)(in_RSI + 8));
    }
    local_14 = (uint)(local_18 < 1);
  }
  if (0 < local_18) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)local_18;
    uVar3 = SUB168(auVar1 * ZEXT816(2),0);
    if (SUB168(auVar1 * ZEXT816(2),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    pvVar4 = operator_new__(uVar3);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)local_18;
    uVar3 = SUB168(auVar2 * ZEXT816(4),0);
    if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    pvVar5 = operator_new__(uVar3);
    if ((pvVar4 != (void *)0x0) && (pvVar5 != (void *)0x0)) {
      Imath_3_2::Rand48::Rand48(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      for (iVar10 = 0; iVar10 < local_18; iVar10 = iVar10 + 1) {
        lVar6 = Imath_3_2::Rand48::nexti((Rand48 *)0x101824);
        *(short *)((long)pvVar4 + (long)iVar10 * 2) = (short)lVar6;
        fVar7 = imath_half_to_float(*(imath_half_bits_t *)((long)pvVar4 + (long)iVar10 * 2));
        *(float *)((long)pvVar5 + (long)iVar10 * 4) = fVar7;
      }
      perf_test_half_to_float(_i_1,(uint16_t *)in_stack_00000008,unaff_retaddr);
      for (iVar9 = 0; iVar9 < local_18; iVar9 = iVar9 + 1) {
        dVar8 = Imath_3_2::Rand48::nextf
                          (in_stack_ffffffffffffffd0,(double)CONCAT44(iVar10,iVar9),
                           (double)in_stack_ffffffffffffffc0);
        *(float *)((long)pvVar5 + (long)iVar9 * 4) = (float)dVar8;
      }
      perf_test_float_to_half((uint16_t *)_i_1,in_stack_00000008,unaff_retaddr);
    }
    if (pvVar4 != (void *)0x0) {
      operator_delete__(pvVar4);
    }
    if (pvVar5 != (void *)0x0) {
      operator_delete__(pvVar5);
    }
  }
  return local_14;
}

Assistant:

int
main (int argc, char* argv[])
{
    int ret        = 0;
    int numentries = 1920 * 1080 * 3;
    if (argc > 1)
    {
        numentries = atoi (argv[1]);

        if (numentries <= 0)
        {
            fprintf (stderr, "Bad entry count '%s'\n", argv[1]);
            ret = 1;
        }
    }

    if (numentries > 0)
    {
        uint16_t* halfs  = new uint16_t[numentries];
        float*    floats = new float[numentries];

        if (halfs && floats)
        {
            Rand48 r(numentries);
            for (int i = 0; i < numentries; ++i)
            {
                halfs[i]  = (uint16_t) r.nexti();
                floats[i] = imath_half_to_float (halfs[i]);
            }
            perf_test_half_to_float (floats, halfs, numentries);

            // test float -> half with real-world values
            for (int i = 0; i < numentries; ++i)
                floats[i] = float(r.nextf(-65504, 65504));
            perf_test_float_to_half (halfs, floats, numentries);
        }

        delete[] halfs;
        delete[] floats;
    }

    return ret;
}